

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

PageantKey * pageant_nth_key(int ssh_version,int i)

{
  tree234 *t;
  int iVar1;
  PageantKey *pk;
  int i_local;
  int ssh_version_local;
  
  t = keytree;
  iVar1 = find_first_key_for_version(ssh_version);
  _i_local = (PageantKey *)index234(t,iVar1 + i);
  if ((_i_local == (PageantKey *)0x0) || ((_i_local->sort).ssh_version != ssh_version)) {
    _i_local = (PageantKey *)0x0;
  }
  return _i_local;
}

Assistant:

static PageantKey *pageant_nth_key(int ssh_version, int i)
{
    PageantKey *pk = index234(
        keytree, find_first_key_for_version(ssh_version) + i);
    if (pk && pk->sort.ssh_version == ssh_version)
        return pk;
    else
        return NULL;
}